

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

Char * __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::format
          (BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,Char **format_str,Arg *arg)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  FormatError *this_00;
  runtime_error *prVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  Char *s;
  string message;
  char local_61;
  char *local_60;
  anon_union_16_12_986ea841_for_Value_0 local_58;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *local_48;
  char *local_40;
  uint local_30;
  int iStack_2c;
  int iStack_28;
  uint uStack_24;
  uint local_20;
  char local_1c;
  
  pcVar5 = *format_str;
  local_30 = 0;
  iStack_2c = 0x20;
  iStack_28 = 0;
  uStack_24 = 0;
  local_20 = 0xffffffff;
  local_1c = '\0';
  local_60 = pcVar5;
  if (*pcVar5 == ':') {
    if (arg->type == CUSTOM) {
      (*(arg->super_Value).field_0.custom.format)
                (this,(void *)(arg->super_Value).field_0.long_long_value,&local_60);
      return local_60;
    }
    local_60 = pcVar5 + 1;
    cVar1 = pcVar5[1];
    if (cVar1 != 0) {
      iStack_28 = 0;
      iVar7 = 0;
      uVar8 = 3;
      do {
        bVar2 = pcVar5[uVar8 - 1];
        if (bVar2 < 0x3e) {
          if (bVar2 == 0x3c) {
            iStack_28 = 1;
            iVar7 = iStack_28;
          }
          else if (bVar2 == 0x3d) {
            iStack_28 = 4;
            iVar7 = iStack_28;
          }
        }
        else if (bVar2 == 0x5e) {
          iStack_28 = 3;
          iVar7 = iStack_28;
        }
        else if (bVar2 == 0x3e) {
          iStack_28 = 2;
          iVar7 = iStack_28;
        }
        if (iVar7 != 0) {
          if (uVar8 == 2) {
            local_60 = pcVar5 + 2;
          }
          else {
            if (cVar1 == '}') break;
            if (cVar1 == '{') {
              this_00 = (FormatError *)__cxa_allocate_exception(0x10);
              FormatError::FormatError(this_00,(CStringRef)0x12c6dc);
              goto LAB_0012234a;
            }
            local_60 = pcVar5 + 3;
            iStack_2c = (int)cVar1;
          }
          if ((iVar7 == 4) && (local_61 = '=', 9 < (int)arg->type)) {
            format<char>((string *)&local_58.string,(CStringRef)0x12c7b5,&local_61);
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,local_58.string.value);
            *(undefined ***)prVar4 = &PTR__runtime_error_00139790;
            __cxa_throw(prVar4,&FormatError::typeinfo,std::runtime_error::~runtime_error);
          }
          break;
        }
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
    cVar1 = *local_60;
    if (cVar1 == ' ') {
      uVar6 = 1;
LAB_0012200d:
      internal::check_sign<char>(&local_60,arg);
      uStack_24 = uStack_24 | uVar6;
    }
    else {
      if (cVar1 == '+') {
        uVar6 = 3;
        goto LAB_0012200d;
      }
      if (cVar1 == '-') {
        uVar6 = 4;
        goto LAB_0012200d;
      }
    }
    if (*local_60 == '#') {
      local_61 = '#';
      if (9 < (int)arg->type) {
        format<char>((string *)&local_58.string,(CStringRef)0x12c7b5,&local_61);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,local_58.string.value);
        *(undefined ***)prVar4 = &PTR__runtime_error_00139790;
        __cxa_throw(prVar4,&FormatError::typeinfo,std::runtime_error::~runtime_error);
      }
      uStack_24 = uStack_24 | 8;
      local_60 = local_60 + 1;
    }
    if (*local_60 == '0') {
      local_61 = '0';
      if (9 < (int)arg->type) {
        format<char>((string *)&local_58.string,(CStringRef)0x12c7b5,&local_61);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,local_58.string.value);
        *(undefined ***)prVar4 = &PTR__runtime_error_00139790;
        __cxa_throw(prVar4,&FormatError::typeinfo,std::runtime_error::~runtime_error);
      }
      iStack_2c = 0x30;
      iStack_28 = 4;
      local_60 = local_60 + 1;
    }
    if ((byte)(*local_60 - 0x30U) < 10) {
      local_30 = internal::parse_nonnegative_int<char>(&local_60);
    }
    else if (*local_60 == '{') {
      if ((local_60[1] == 0x5f) || ((byte)((local_60[1] & 0xdfU) + 0xbf) < 0x1a)) {
        local_60 = local_60 + 1;
        parse_arg_name((Arg *)&local_58.string,this,&local_60);
      }
      else {
        local_60 = local_60 + 1;
        parse_arg_index((Arg *)&local_58.string,this,&local_60);
      }
      pcVar5 = local_60 + 1;
      if (*local_60 != '}') {
        local_60 = pcVar5;
        this_00 = (FormatError *)__cxa_allocate_exception(0x10);
        FormatError::FormatError(this_00,(CStringRef)0x12c5ac);
        goto LAB_0012234a;
      }
      pcVar3 = local_58.string.value;
      switch(local_48._0_4_) {
      case 2:
        pcVar3 = (char *)(long)local_58.int_value;
        if ((long)pcVar3 < 0) {
          local_60 = pcVar5;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x12c6f7);
          goto LAB_0012234a;
        }
        break;
      case 3:
        pcVar3 = (char *)(local_58.ulong_long_value & 0xffffffff);
        break;
      case 4:
        if (local_58.long_long_value < 0) {
          local_60 = pcVar5;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x12c6f7);
          goto LAB_0012234a;
        }
        break;
      case 5:
        break;
      default:
        local_60 = pcVar5;
        this_00 = (FormatError *)__cxa_allocate_exception(0x10);
        FormatError::FormatError(this_00,(CStringRef)0x12c706);
        goto LAB_0012234a;
      }
      if ((ulong)pcVar3 >> 0x1f != 0) {
        local_60 = pcVar5;
        this_00 = (FormatError *)__cxa_allocate_exception(0x10);
        FormatError::FormatError(this_00,(CStringRef)0x12c6ca);
        goto LAB_0012234a;
      }
      local_30 = (uint)pcVar3;
      local_60 = pcVar5;
    }
    if (*local_60 == '.') {
      local_20 = 0;
      if ((byte)(local_60[1] - 0x30U) < 10) {
        local_60 = local_60 + 1;
        local_20 = internal::parse_nonnegative_int<char>(&local_60);
      }
      else {
        if (local_60[1] != '{') {
          local_60 = local_60 + 1;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x12c747);
          goto LAB_0012234a;
        }
        if ((local_60[2] == 0x5f) || ((byte)((local_60[2] & 0xdfU) + 0xbf) < 0x1a)) {
          local_60 = local_60 + 2;
          parse_arg_name((Arg *)&local_58.string,this,&local_60);
        }
        else {
          local_60 = local_60 + 2;
          parse_arg_index((Arg *)&local_58.string,this,&local_60);
        }
        pcVar5 = local_60 + 1;
        if (*local_60 != '}') {
          local_60 = pcVar5;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x12c5ac);
          goto LAB_0012234a;
        }
        pcVar3 = (char *)local_58.long_long_value;
        switch(local_48._0_4_) {
        case 2:
          pcVar3 = (char *)(long)local_58.int_value;
          if ((long)pcVar3 < 0) {
            local_60 = pcVar5;
            this_00 = (FormatError *)__cxa_allocate_exception(0x10);
            FormatError::FormatError(this_00,(CStringRef)0x12c71b);
            goto LAB_0012234a;
          }
          break;
        case 3:
          pcVar3 = (char *)(local_58.ulong_long_value & 0xffffffff);
          break;
        case 4:
          if (local_58.long_long_value < 0) {
            local_60 = pcVar5;
            this_00 = (FormatError *)__cxa_allocate_exception(0x10);
            FormatError::FormatError(this_00,(CStringRef)0x12c71b);
            goto LAB_0012234a;
          }
          break;
        case 5:
          break;
        default:
          local_60 = pcVar5;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x12c72e);
          goto LAB_0012234a;
        }
        if ((ulong)pcVar3 >> 0x1f != 0) {
          local_60 = pcVar5;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x12c6ca);
          goto LAB_0012234a;
        }
        local_20 = (uint)pcVar3;
        local_60 = pcVar5;
      }
      if (((int)arg->type < 8) || (arg->type == POINTER)) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        pcVar5 = "integer";
        if (arg->type == POINTER) {
          pcVar5 = "pointer";
        }
        format<char[8]>((string *)&local_58.string,(CStringRef)0x12c763,(char (*) [8])pcVar5);
        std::runtime_error::runtime_error(prVar4,local_58.string.value);
        *(undefined ***)prVar4 = &PTR__runtime_error_00139790;
        __cxa_throw(prVar4,&FormatError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if ((*local_60 != '\0') && (*local_60 != '}')) {
      local_1c = *local_60;
      local_60 = local_60 + 1;
    }
  }
  if (*local_60 == '}') {
    local_58.long_long_value = (LongLong)this->writer_;
    local_58.custom.format = (FormatFunc)&local_30;
    local_40 = local_60;
    local_60 = local_60 + 1;
    local_48 = this;
    ArgVisitor<fmt::ArgFormatter<char>,_void>::visit
              ((ArgVisitor<fmt::ArgFormatter<char>,_void> *)&local_58.string,arg);
    return local_60;
  }
  local_60 = local_60 + 1;
  this_00 = (FormatError *)__cxa_allocate_exception(0x10);
  FormatError::FormatError(this_00,(CStringRef)0x12c798);
LAB_0012234a:
  __cxa_throw(this_00,&FormatError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Char *BasicFormatter<Char, ArgFormatter>::format(
    const Char *&format_str, const internal::Arg &arg) {
  using internal::Arg;
  const Char *s = format_str;
  typename ArgFormatter::SpecType spec;
  if (*s == ':') {
    if (arg.type == Arg::CUSTOM) {
      arg.custom.format(this, arg.custom.value, &s);
      return s;
    }
    ++s;
    // Parse fill and alignment.
    if (Char c = *s) {
      const Char *p = s + 1;
      spec.align_ = ALIGN_DEFAULT;
      do {
        switch (*p) {
          case '<':
            spec.align_ = ALIGN_LEFT;
            break;
          case '>':
            spec.align_ = ALIGN_RIGHT;
            break;
          case '=':
            spec.align_ = ALIGN_NUMERIC;
            break;
          case '^':
            spec.align_ = ALIGN_CENTER;
            break;
        }
        if (spec.align_ != ALIGN_DEFAULT) {
          if (p != s) {
            if (c == '}') break;
            if (c == '{')
              FMT_THROW(FormatError("invalid fill character '{'"));
            s += 2;
            spec.fill_ = c;
          } else ++s;
          if (spec.align_ == ALIGN_NUMERIC)
            require_numeric_argument(arg, '=');
          break;
        }
      } while (--p >= s);
    }

    // Parse sign.
    switch (*s) {
      case '+':
        check_sign(s, arg);
        spec.flags_ |= SIGN_FLAG | PLUS_FLAG;
        break;
      case '-':
        check_sign(s, arg);
        spec.flags_ |= MINUS_FLAG;
        break;
      case ' ':
        check_sign(s, arg);
        spec.flags_ |= SIGN_FLAG;
        break;
    }

    if (*s == '#') {
      require_numeric_argument(arg, '#');
      spec.flags_ |= HASH_FLAG;
      ++s;
    }

    // Parse zero flag.
    if (*s == '0') {
      require_numeric_argument(arg, '0');
      spec.align_ = ALIGN_NUMERIC;
      spec.fill_ = '0';
      ++s;
    }

    // Parse width.
    if ('0' <= *s && *s <= '9') {
      spec.width_ = internal::parse_nonnegative_int(s);
    } else if (*s == '{') {
      ++s;
      Arg width_arg = internal::is_name_start(*s) ?
            parse_arg_name(s) : parse_arg_index(s);
      if (*s++ != '}')
        FMT_THROW(FormatError("invalid format string"));
      ULongLong value = 0;
      switch (width_arg.type) {
      case Arg::INT:
        if (width_arg.int_value < 0)
          FMT_THROW(FormatError("negative width"));
        value = width_arg.int_value;
        break;
      case Arg::UINT:
        value = width_arg.uint_value;
        break;
      case Arg::LONG_LONG:
        if (width_arg.long_long_value < 0)
          FMT_THROW(FormatError("negative width"));
        value = width_arg.long_long_value;
        break;
      case Arg::ULONG_LONG:
        value = width_arg.ulong_long_value;
        break;
      default:
        FMT_THROW(FormatError("width is not integer"));
      }
      unsigned max_int = (std::numeric_limits<int>::max)();
      if (value > max_int)
        FMT_THROW(FormatError("number is too big"));
      spec.width_ = static_cast<int>(value);
    }

    // Parse precision.
    if (*s == '.') {
      ++s;
      spec.precision_ = 0;
      if ('0' <= *s && *s <= '9') {
        spec.precision_ = internal::parse_nonnegative_int(s);
      } else if (*s == '{') {
        ++s;
        Arg precision_arg = internal::is_name_start(*s) ?
              parse_arg_name(s) : parse_arg_index(s);
        if (*s++ != '}')
          FMT_THROW(FormatError("invalid format string"));
        ULongLong value = 0;
        switch (precision_arg.type) {
          case Arg::INT:
            if (precision_arg.int_value < 0)
              FMT_THROW(FormatError("negative precision"));
            value = precision_arg.int_value;
            break;
          case Arg::UINT:
            value = precision_arg.uint_value;
            break;
          case Arg::LONG_LONG:
            if (precision_arg.long_long_value < 0)
              FMT_THROW(FormatError("negative precision"));
            value = precision_arg.long_long_value;
            break;
          case Arg::ULONG_LONG:
            value = precision_arg.ulong_long_value;
            break;
          default:
            FMT_THROW(FormatError("precision is not integer"));
        }
        unsigned max_int = (std::numeric_limits<int>::max)();
        if (value > max_int)
          FMT_THROW(FormatError("number is too big"));
        spec.precision_ = static_cast<int>(value);
      } else {
        FMT_THROW(FormatError("missing precision specifier"));
      }
      if (arg.type <= Arg::LAST_INTEGER_TYPE || arg.type == Arg::POINTER) {
        FMT_THROW(FormatError(
            fmt::format("precision not allowed in {} format specifier",
            arg.type == Arg::POINTER ? "pointer" : "integer")));
      }
    }

    // Parse type.
    if (*s != '}' && *s)
      spec.type_ = static_cast<char>(*s++);
  }

  if (*s++ != '}')
    FMT_THROW(FormatError("missing '}' in format string"));

  // Format argument.
  ArgFormatter(*this, spec, s - 1).visit(arg);
  return s;
}